

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerNewScIntArray(Lowerer *this,Instr *arrInstr)

{
  Instr *pIVar1;
  bool bVar2;
  intptr_t weakFuncRef_00;
  JitProfilingInstr *pJVar3;
  ProfiledInstr *pPVar4;
  JITTimeProfileInfo *pJVar5;
  ArrayCallSiteInfo *arrayInfo_00;
  intptr_t arrayInfoAddr_00;
  AddrOpnd *pAVar6;
  Opnd *opndArg;
  ProfileId local_5a;
  Opnd *elementsOpnd;
  intptr_t arrayInfoAddr;
  ArrayCallSiteInfo *arrayInfo;
  ProfileId profileId;
  intptr_t weakFuncRef;
  JnHelperMethod helperMethod;
  Instr *instrPrev;
  Instr *arrInstr_local;
  Lowerer *this_local;
  
  pIVar1 = arrInstr->m_prev;
  weakFuncRef._4_4_ = HelperScrArr_OP_NewScIntArray;
  bVar2 = IR::Instr::IsJitProfilingInstr(arrInstr);
  if ((((bVar2) || (bVar2 = IR::Instr::IsProfiledInstr(arrInstr), bVar2)) &&
      (bVar2 = Func::HasProfileInfo(arrInstr->m_func), bVar2)) &&
     (weakFuncRef_00 = Func::GetWeakFuncRef(arrInstr->m_func), weakFuncRef_00 != 0)) {
    bVar2 = IR::Instr::IsJitProfilingInstr(arrInstr);
    if (bVar2) {
      pJVar3 = IR::Instr::AsJitProfilingInstr(arrInstr);
      local_5a = pJVar3->profileId;
    }
    else {
      pPVar4 = IR::Instr::AsProfiledInstr(arrInstr);
      local_5a = (pPVar4->u).field_3.fldInfoData.f1;
    }
    pJVar5 = Func::GetReadOnlyProfileInfo(arrInstr->m_func);
    arrayInfo_00 = JITTimeProfileInfo::GetArrayCallSiteInfo(pJVar5,local_5a);
    pJVar5 = Func::GetReadOnlyProfileInfo(arrInstr->m_func);
    arrayInfoAddr_00 = JITTimeProfileInfo::GetArrayCallSiteInfoAddr(pJVar5,local_5a);
    bVar2 = IR::Instr::IsProfiledInstr(arrInstr);
    if (((bVar2) &&
        ((bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,CopyOnAccessArrayPhase), bVar2 ||
         (((arrayInfo_00->field_0).bits >> 2 & 1) != 0)))) &&
       (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,CopyOnAccessArrayPhase), !bVar2)) {
      GenerateProfiledNewScIntArrayFastPath
                (this,arrInstr,arrayInfo_00,arrayInfoAddr_00,weakFuncRef_00);
    }
    pAVar6 = IR::AddrOpnd::New(weakFuncRef_00,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,
                               false,(Var)0x0);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,arrInstr,&pAVar6->super_Opnd);
    pAVar6 = IR::AddrOpnd::New(arrayInfoAddr_00,AddrOpndKindDynamicArrayCallSiteInfo,this->m_func,
                               false,(Var)0x0);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,arrInstr,&pAVar6->super_Opnd);
    weakFuncRef._4_4_ = HelperScrArr_ProfiledNewScIntArray;
  }
  LoadScriptContext(this,arrInstr);
  opndArg = IR::Instr::UnlinkSrc1(arrInstr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,arrInstr,opndArg);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,arrInstr,weakFuncRef._4_4_,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScIntArray(IR::Instr *arrInstr)
{
    IR::Instr *instrPrev = arrInstr->m_prev;
    IR::JnHelperMethod helperMethod = IR::HelperScrArr_OP_NewScIntArray;

    if ((arrInstr->IsJitProfilingInstr() || arrInstr->IsProfiledInstr()) && arrInstr->m_func->HasProfileInfo())
    {
        intptr_t weakFuncRef = arrInstr->m_func->GetWeakFuncRef();
        if (weakFuncRef)
        {
            // Technically a load of the same memory address either way.
            Js::ProfileId profileId =
                arrInstr->IsJitProfilingInstr()
                    ? arrInstr->AsJitProfilingInstr()->profileId
                    : static_cast<Js::ProfileId>(arrInstr->AsProfiledInstr()->u.profileId);
            Js::ArrayCallSiteInfo *arrayInfo = arrInstr->m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId);
            intptr_t arrayInfoAddr = arrInstr->m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfoAddr(profileId);

            // Only do fast-path if it isn't a JitProfiling instr and not copy-on-access array
            if (arrInstr->IsProfiledInstr()
#if ENABLE_COPYONACCESS_ARRAY
                && (PHASE_OFF1(Js::Phase::CopyOnAccessArrayPhase) || arrayInfo->isNotCopyOnAccessArray) && !PHASE_FORCE1(Js::Phase::CopyOnAccessArrayPhase)
#endif
                )
            {
                GenerateProfiledNewScIntArrayFastPath(arrInstr, arrayInfo, arrayInfoAddr, weakFuncRef);
            }

            m_lowererMD.LoadHelperArgument(arrInstr, IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func));
            m_lowererMD.LoadHelperArgument(arrInstr, IR::AddrOpnd::New(arrayInfoAddr, IR::AddrOpndKindDynamicArrayCallSiteInfo, m_func));
            helperMethod = IR::HelperScrArr_ProfiledNewScIntArray;
        }
    }

    LoadScriptContext(arrInstr);

    IR::Opnd *elementsOpnd = arrInstr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(arrInstr, elementsOpnd);
    m_lowererMD.ChangeToHelperCall(arrInstr, helperMethod);

    return instrPrev;
}